

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::anon_unknown_0::CUnescapeInternal
          (anon_unknown_0 *this,string_view source,bool leave_nulls_escaped,Nonnull<char_*> dest,
          Nonnull<ptrdiff_t_*> dest_len,Nullable<std::string_*> error)

{
  uchar *puVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  char32_t cVar4;
  int iVar5;
  uint uVar6;
  const_pointer pvVar7;
  size_type sVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  undefined7 in_register_00000009;
  bool bVar12;
  string_view src;
  string_view src_00;
  bool local_3b9;
  allocator<char> local_381;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string_view<char,_std::char_traits<char>_> local_340;
  allocator local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  allocator local_2e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  char32_t local_27c;
  int local_278;
  uint32_t newrune;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  char *local_230;
  char *hex_start_2;
  undefined1 auStack_220 [4];
  char32_t rune_1;
  char *local_218;
  allocator local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  int local_1c8;
  allocator local_1c1;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  char *local_180;
  char *hex_start_1;
  char *pcStack_170;
  char32_t rune;
  size_t hex_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  char *local_100;
  char *hex_start;
  char *pcStack_f0;
  uint ch_1;
  size_t octal_size;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  uint local_6c;
  char *pcStack_68;
  uint ch;
  char *octal_start;
  char *last_byte;
  char *end;
  char *p;
  char *d;
  Nullable<std::string_*> error_local;
  Nonnull<ptrdiff_t_*> dest_len_local;
  Nonnull<char_*> dest_local;
  undefined1 auStack_20 [7];
  bool leave_nulls_escaped_local;
  string_view source_local;
  
  p = (char *)CONCAT71(in_register_00000009,leave_nulls_escaped);
  source_local._M_len = source._M_len;
  dest_local._7_1_ = (byte)source._M_str & 1;
  d = (char *)dest_len;
  error_local = (Nullable<std::string_*>)dest;
  dest_len_local = (Nonnull<ptrdiff_t_*>)p;
  _auStack_20 = this;
  pvVar7 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  end = pvVar7;
  sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  last_byte = pvVar7 + sVar8;
  octal_start = last_byte + -1;
  while( true ) {
    bVar12 = false;
    if ((end == p) && (bVar12 = false, end < last_byte)) {
      bVar12 = *end != '\\';
    }
    if (!bVar12) break;
    end = end + 1;
    p = p + 1;
  }
  do {
    if (last_byte <= end) {
      *(long *)error_local = (long)p - (long)dest_len_local;
      return true;
    }
    if (*end == '\\') {
      pcVar9 = end + 1;
      if (octal_start < pcVar9) {
        if (d != (char *)0x0) {
          end = pcVar9;
          std::__cxx11::string::operator=((string *)d,"String cannot end with \\");
        }
        return false;
      }
      switch(*pcVar9) {
      case '\"':
        *p = '\"';
        p = p + 1;
        break;
      default:
        if (d != (char *)0x0) {
          end = pcVar9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_380,"Unknown escape sequence: \\",&local_381);
          std::operator+(&local_360,&local_380,*end);
          std::__cxx11::string::operator=((string *)d,(string *)&local_360);
          std::__cxx11::string::~string((string *)&local_360);
          std::__cxx11::string::~string((string *)&local_380);
          std::allocator<char>::~allocator(&local_381);
        }
        return false;
      case '\'':
        *p = '\'';
        p = p + 1;
        break;
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
        local_6c = (int)*pcVar9 - 0x30;
        pcStack_68 = pcVar9;
        if ((pcVar9 < octal_start) &&
           (pcVar10 = end + 2, end = pcVar9, bVar12 = is_octal_digit(*pcVar10), pcVar9 = end, bVar12
           )) {
          local_6c = local_6c * 8 + end[1] + -0x30;
          pcVar9 = end + 1;
        }
        end = pcVar9;
        if ((end < octal_start) && (bVar12 = is_octal_digit(end[1]), bVar12)) {
          local_6c = local_6c * 8 + end[1] + -0x30;
          end = end + 1;
        }
        pcVar9 = pcStack_68;
        if (0xff < local_6c) {
          if (d != (char *)0x0) {
            pcVar10 = end + (1 - (long)pcStack_68);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_d0,pcVar9,(ulong)pcVar10,&local_d1);
            std::operator+(&local_b0,"Value of \\",&local_d0);
            std::operator+(&local_90,&local_b0," exceeds 0xff");
            std::__cxx11::string::operator=((string *)d,(string *)&local_90);
            std::__cxx11::string::~string((string *)&local_90);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::allocator<char>::~allocator((allocator<char> *)&local_d1);
          }
          return false;
        }
        if ((local_6c == 0) && ((dest_local._7_1_ & 1) != 0)) {
          pcStack_f0 = end + (1 - (long)pcStack_68);
          pcVar9 = p + 1;
          *p = '\\';
          p = pcVar9;
          memmove(pcVar9,pcStack_68,(size_t)pcStack_f0);
          p = p + (long)pcStack_f0;
          pcVar9 = end;
        }
        else {
          *p = (char)local_6c;
          p = p + 1;
          pcVar9 = end;
        }
        break;
      case '?':
        *p = '?';
        p = p + 1;
        break;
      case 'U':
        hex_start_2._4_4_ = L'\0';
        local_230 = pcVar9;
        if (last_byte <= end + 9) {
          if (d != (char *)0x0) {
            end = pcVar9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&i_1,pcVar9,1,(allocator *)((long)&newrune + 3));
            std::operator+(&local_250,"\\U must be followed by 8 hex digits: \\",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1
                          );
            std::__cxx11::string::operator=((string *)d,(string *)&local_250);
            std::__cxx11::string::~string((string *)&local_250);
            std::__cxx11::string::~string((string *)&i_1);
            std::allocator<char>::~allocator((allocator<char> *)((long)&newrune + 3));
          }
          return false;
        }
        end = pcVar9;
        for (local_278 = 0; cVar4 = hex_start_2._4_4_, local_278 < 8; local_278 = local_278 + 1) {
          bVar12 = ascii_isxdigit(end[1]);
          pcVar9 = local_230;
          if (!bVar12) {
            if (d != (char *)0x0) {
              pcVar10 = end + (1 - (long)local_230);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_328,pcVar9,(ulong)pcVar10,&local_329);
              std::operator+(&local_308,"\\U must be followed by 8 hex digits: \\",&local_328);
              std::__cxx11::string::operator=((string *)d,(string *)&local_308);
              std::__cxx11::string::~string((string *)&local_308);
              std::__cxx11::string::~string((string *)&local_328);
              std::allocator<char>::~allocator((allocator<char> *)&local_329);
            }
            return false;
          }
          iVar5 = hex_start_2._4_4_ * 0x10;
          pcVar9 = end + 1;
          end = end + 1;
          uVar6 = hex_digit_to_int(*pcVar9);
          pcVar9 = local_230;
          local_27c = iVar5 + uVar6;
          if (0x10ffff < (uint)local_27c) {
            if (d != (char *)0x0) {
              pcVar10 = end + (1 - (long)local_230);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_2e0,pcVar9,(ulong)pcVar10,&local_2e1);
              std::operator+(&local_2c0,"Value of \\",&local_2e0);
              std::operator+(&local_2a0,&local_2c0," exceeds Unicode limit (0x10FFFF)");
              std::__cxx11::string::operator=((string *)d,(string *)&local_2a0);
              std::__cxx11::string::~string((string *)&local_2a0);
              std::__cxx11::string::~string((string *)&local_2c0);
              std::__cxx11::string::~string((string *)&local_2e0);
              std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
            }
            return false;
          }
          hex_start_2._4_4_ = local_27c;
        }
        if ((hex_start_2._4_4_ == L'\0') && ((dest_local._7_1_ & 1) != 0)) {
          *p = '\\';
          uVar3 = *(undefined8 *)local_230;
          p[9] = local_230[8];
          *(undefined8 *)(p + 1) = uVar3;
          p = p + 10;
          pcVar9 = end;
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_340,local_230,9);
          src_00._M_str = d;
          src_00._M_len = (size_t)local_340._M_str;
          bVar12 = IsSurrogate((anon_unknown_0 *)(ulong)(uint)cVar4,(char32_t)local_340._M_len,
                               src_00,(Nullable<std::string_*>)dest);
          if (bVar12) {
            return false;
          }
          sVar11 = strings_internal::EncodeUTF8Char(p,hex_start_2._4_4_);
          p = p + sVar11;
          pcVar9 = end;
        }
        break;
      case 'X':
      case 'x':
        if (octal_start <= pcVar9) {
          if (d != (char *)0x0) {
            end = pcVar9;
            std::__cxx11::string::operator=((string *)d,"String cannot end with \\x");
          }
          return false;
        }
        puVar1 = (uchar *)(end + 2);
        end = pcVar9;
        bVar12 = ascii_isxdigit(*puVar1);
        if (!bVar12) {
          if (d != (char *)0x0) {
            std::__cxx11::string::operator=((string *)d,"\\x cannot be followed by a non-hex digit")
            ;
          }
          return false;
        }
        hex_start._4_4_ = 0;
        local_100 = end;
        while( true ) {
          local_3b9 = false;
          if (end < octal_start) {
            local_3b9 = ascii_isxdigit(end[1]);
          }
          pcVar9 = local_100;
          if (local_3b9 == false) break;
          iVar5 = hex_start._4_4_ * 0x10;
          pcVar9 = end + 1;
          end = end + 1;
          uVar6 = hex_digit_to_int(*pcVar9);
          hex_start._4_4_ = iVar5 + uVar6;
        }
        if (0xff < hex_start._4_4_) {
          if (d != (char *)0x0) {
            pcVar10 = end + (1 - (long)local_100);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_160,pcVar9,(ulong)pcVar10,(allocator *)((long)&hex_size + 7)
                      );
            std::operator+(&local_140,"Value of \\",&local_160);
            std::operator+(&local_120,&local_140," exceeds 0xff");
            std::__cxx11::string::operator=((string *)d,(string *)&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_140);
            std::__cxx11::string::~string((string *)&local_160);
            std::allocator<char>::~allocator((allocator<char> *)((long)&hex_size + 7));
          }
          return false;
        }
        if ((hex_start._4_4_ == 0) && ((dest_local._7_1_ & 1) != 0)) {
          pcStack_170 = end + (1 - (long)local_100);
          pcVar9 = p + 1;
          *p = '\\';
          p = pcVar9;
          memmove(pcVar9,local_100,(size_t)pcStack_170);
          p = p + (long)pcStack_170;
          pcVar9 = end;
        }
        else {
          *p = (char)hex_start._4_4_;
          p = p + 1;
          pcVar9 = end;
        }
        break;
      case '\\':
        *p = '\\';
        p = p + 1;
        break;
      case 'a':
        *p = '\a';
        p = p + 1;
        break;
      case 'b':
        *p = '\b';
        p = p + 1;
        break;
      case 'f':
        *p = '\f';
        p = p + 1;
        break;
      case 'n':
        *p = '\n';
        p = p + 1;
        break;
      case 'r':
        *p = '\r';
        p = p + 1;
        break;
      case 't':
        *p = '\t';
        p = p + 1;
        break;
      case 'u':
        hex_start_1._4_4_ = L'\0';
        local_180 = pcVar9;
        if (last_byte <= end + 5) {
          if (d != (char *)0x0) {
            end = pcVar9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&i,pcVar9,1,&local_1c1);
            std::operator+(&local_1a0,"\\u must be followed by 4 hex digits: \\",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
            std::__cxx11::string::operator=((string *)d,(string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&i);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
          }
          return false;
        }
        end = pcVar9;
        for (local_1c8 = 0; cVar4 = hex_start_1._4_4_, local_1c8 < 4; local_1c8 = local_1c8 + 1) {
          bVar12 = ascii_isxdigit(end[1]);
          pcVar9 = local_180;
          if (!bVar12) {
            if (d != (char *)0x0) {
              pcVar10 = end + (1 - (long)local_180);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_208,pcVar9,(ulong)pcVar10,&local_209);
              std::operator+(&local_1e8,"\\u must be followed by 4 hex digits: \\",&local_208);
              std::__cxx11::string::operator=((string *)d,(string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_208);
              std::allocator<char>::~allocator((allocator<char> *)&local_209);
            }
            return false;
          }
          iVar5 = hex_start_1._4_4_ * 0x10;
          pcVar9 = end + 1;
          end = end + 1;
          uVar6 = hex_digit_to_int(*pcVar9);
          hex_start_1._4_4_ = iVar5 + uVar6;
        }
        if ((hex_start_1._4_4_ == L'\0') && ((dest_local._7_1_ & 1) != 0)) {
          *p = '\\';
          uVar2 = *(undefined4 *)local_180;
          p[5] = local_180[4];
          *(undefined4 *)(p + 1) = uVar2;
          p = p + 6;
          pcVar9 = end;
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_220,local_180,5);
          src._M_str = d;
          src._M_len = (size_t)local_218;
          bVar12 = IsSurrogate((anon_unknown_0 *)(ulong)(uint)cVar4,(char32_t)_auStack_220,src,
                               (Nullable<std::string_*>)dest);
          if (bVar12) {
            return false;
          }
          sVar11 = strings_internal::EncodeUTF8Char(p,hex_start_1._4_4_);
          p = p + sVar11;
          pcVar9 = end;
        }
        break;
      case 'v':
        *p = '\v';
        p = p + 1;
      }
    }
    else {
      *p = *end;
      p = p + 1;
      pcVar9 = end;
    }
    end = pcVar9 + 1;
  } while( true );
}

Assistant:

bool CUnescapeInternal(absl::string_view source, bool leave_nulls_escaped,
                       absl::Nonnull<char*> dest,
                       absl::Nonnull<ptrdiff_t*> dest_len,
                       absl::Nullable<std::string*> error) {
  char* d = dest;
  const char* p = source.data();
  const char* end = p + source.size();
  const char* last_byte = end - 1;

  // Small optimization for case where source = dest and there's no escaping
  while (p == d && p < end && *p != '\\') p++, d++;

  while (p < end) {
    if (*p != '\\') {
      *d++ = *p++;
    } else {
      if (++p > last_byte) {  // skip past the '\\'
        if (error) *error = "String cannot end with \\";
        return false;
      }
      switch (*p) {
        case 'a':  *d++ = '\a';  break;
        case 'b':  *d++ = '\b';  break;
        case 'f':  *d++ = '\f';  break;
        case 'n':  *d++ = '\n';  break;
        case 'r':  *d++ = '\r';  break;
        case 't':  *d++ = '\t';  break;
        case 'v':  *d++ = '\v';  break;
        case '\\': *d++ = '\\';  break;
        case '?':  *d++ = '\?';  break;    // \?  Who knew?
        case '\'': *d++ = '\'';  break;
        case '"':  *d++ = '\"';  break;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7': {
          // octal digit: 1 to 3 digits
          const char* octal_start = p;
          unsigned int ch = static_cast<unsigned int>(*p - '0');  // digit 1
          if (p < last_byte && is_octal_digit(p[1]))
            ch = ch * 8 + static_cast<unsigned int>(*++p - '0');  // digit 2
          if (p < last_byte && is_octal_digit(p[1]))
            ch = ch * 8 + static_cast<unsigned int>(*++p - '0');  // digit 3
          if (ch > 0xff) {
            if (error) {
              *error = "Value of \\" +
                       std::string(octal_start,
                                   static_cast<size_t>(p + 1 - octal_start)) +
                       " exceeds 0xff";
            }
            return false;
          }
          if ((ch == 0) && leave_nulls_escaped) {
            // Copy the escape sequence for the null character
            const size_t octal_size = static_cast<size_t>(p + 1 - octal_start);
            *d++ = '\\';
            memmove(d, octal_start, octal_size);
            d += octal_size;
            break;
          }
          *d++ = static_cast<char>(ch);
          break;
        }
        case 'x':
        case 'X': {
          if (p >= last_byte) {
            if (error) *error = "String cannot end with \\x";
            return false;
          } else if (!absl::ascii_isxdigit(static_cast<unsigned char>(p[1]))) {
            if (error) *error = "\\x cannot be followed by a non-hex digit";
            return false;
          }
          unsigned int ch = 0;
          const char* hex_start = p;
          while (p < last_byte &&
                 absl::ascii_isxdigit(static_cast<unsigned char>(p[1])))
            // Arbitrarily many hex digits
            ch = (ch << 4) + hex_digit_to_int(*++p);
          if (ch > 0xFF) {
            if (error) {
              *error = "Value of \\" +
                       std::string(hex_start,
                                   static_cast<size_t>(p + 1 - hex_start)) +
                       " exceeds 0xff";
            }
            return false;
          }
          if ((ch == 0) && leave_nulls_escaped) {
            // Copy the escape sequence for the null character
            const size_t hex_size = static_cast<size_t>(p + 1 - hex_start);
            *d++ = '\\';
            memmove(d, hex_start, hex_size);
            d += hex_size;
            break;
          }
          *d++ = static_cast<char>(ch);
          break;
        }
        case 'u': {
          // \uhhhh => convert 4 hex digits to UTF-8
          char32_t rune = 0;
          const char* hex_start = p;
          if (p + 4 >= end) {
            if (error) {
              *error = "\\u must be followed by 4 hex digits: \\" +
                       std::string(hex_start,
                                   static_cast<size_t>(p + 1 - hex_start));
            }
            return false;
          }
          for (int i = 0; i < 4; ++i) {
            // Look one char ahead.
            if (absl::ascii_isxdigit(static_cast<unsigned char>(p[1]))) {
              rune = (rune << 4) + hex_digit_to_int(*++p);  // Advance p.
            } else {
              if (error) {
                *error = "\\u must be followed by 4 hex digits: \\" +
                         std::string(hex_start,
                                     static_cast<size_t>(p + 1 - hex_start));
              }
              return false;
            }
          }
          if ((rune == 0) && leave_nulls_escaped) {
            // Copy the escape sequence for the null character
            *d++ = '\\';
            memmove(d, hex_start, 5);  // u0000
            d += 5;
            break;
          }
          if (IsSurrogate(rune, absl::string_view(hex_start, 5), error)) {
            return false;
          }
          d += strings_internal::EncodeUTF8Char(d, rune);
          break;
        }
        case 'U': {
          // \Uhhhhhhhh => convert 8 hex digits to UTF-8
          char32_t rune = 0;
          const char* hex_start = p;
          if (p + 8 >= end) {
            if (error) {
              *error = "\\U must be followed by 8 hex digits: \\" +
                       std::string(hex_start,
                                   static_cast<size_t>(p + 1 - hex_start));
            }
            return false;
          }
          for (int i = 0; i < 8; ++i) {
            // Look one char ahead.
            if (absl::ascii_isxdigit(static_cast<unsigned char>(p[1]))) {
              // Don't change rune until we're sure this
              // is within the Unicode limit, but do advance p.
              uint32_t newrune = (rune << 4) + hex_digit_to_int(*++p);
              if (newrune > 0x10FFFF) {
                if (error) {
                  *error = "Value of \\" +
                           std::string(hex_start,
                                       static_cast<size_t>(p + 1 - hex_start)) +
                           " exceeds Unicode limit (0x10FFFF)";
                }
                return false;
              } else {
                rune = newrune;
              }
            } else {
              if (error) {
                *error = "\\U must be followed by 8 hex digits: \\" +
                         std::string(hex_start,
                                     static_cast<size_t>(p + 1 - hex_start));
              }
              return false;
            }
          }
          if ((rune == 0) && leave_nulls_escaped) {
            // Copy the escape sequence for the null character
            *d++ = '\\';
            memmove(d, hex_start, 9);  // U00000000
            d += 9;
            break;
          }
          if (IsSurrogate(rune, absl::string_view(hex_start, 9), error)) {
            return false;
          }
          d += strings_internal::EncodeUTF8Char(d, rune);
          break;
        }
        default: {
          if (error) *error = std::string("Unknown escape sequence: \\") + *p;
          return false;
        }
      }
      p++;                                 // read past letter we escaped
    }
  }
  *dest_len = d - dest;
  return true;
}